

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

dgMatrix * __thiscall
dgMatrix::operator*(dgMatrix *__return_storage_ptr__,dgMatrix *this,dgMatrix *B)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  dgTemplateVector<float> local_60;
  dgTemplateVector<float> local_50;
  dgTemplateVector<float> local_40;
  
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_front).super_dgTemplateVector<float>.m_x;
  fVar3 = (this->m_front).super_dgTemplateVector<float>.m_z;
  fVar4 = (this->m_front).super_dgTemplateVector<float>.m_w;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_x)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_y)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_z)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_w)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_w));
  dgVector::dgVector((dgVector *)&local_40,auVar5._0_4_,auVar6._0_4_,auVar7._0_4_,auVar8._0_4_);
  fVar1 = (this->m_up).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_up).super_dgTemplateVector<float>.m_x;
  fVar3 = (this->m_up).super_dgTemplateVector<float>.m_z;
  fVar4 = (this->m_up).super_dgTemplateVector<float>.m_w;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_x)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_y)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_z)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_w)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_w));
  dgVector::dgVector((dgVector *)&local_50,auVar5._0_4_,auVar6._0_4_,auVar7._0_4_,auVar8._0_4_);
  fVar1 = (this->m_right).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_right).super_dgTemplateVector<float>.m_x;
  fVar3 = (this->m_right).super_dgTemplateVector<float>.m_z;
  fVar4 = (this->m_right).super_dgTemplateVector<float>.m_w;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_x)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_y)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_z)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_w)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_w));
  dgVector::dgVector((dgVector *)&local_60,auVar5._0_4_,auVar6._0_4_,auVar7._0_4_,auVar8._0_4_);
  fVar1 = (this->m_posit).super_dgTemplateVector<float>.m_y;
  fVar2 = (this->m_posit).super_dgTemplateVector<float>.m_x;
  fVar3 = (this->m_posit).super_dgTemplateVector<float>.m_z;
  fVar4 = (this->m_posit).super_dgTemplateVector<float>.m_w;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_x)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_y)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_z)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (B->m_up).super_dgTemplateVector<float>.m_w)),
                           ZEXT416((uint)fVar2),
                           ZEXT416((uint)(B->m_front).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(B->m_right).super_dgTemplateVector<float>.m_w));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_y));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_z));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),
                           ZEXT416((uint)(B->m_posit).super_dgTemplateVector<float>.m_w));
  dgVector::dgVector(&__return_storage_ptr__->m_posit,auVar5._0_4_,auVar6._0_4_,auVar7._0_4_,
                     auVar8._0_4_);
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x = local_40.m_x;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y = local_40.m_y;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z = local_40.m_z;
  (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w = local_40.m_w;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x = local_50.m_x;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y = local_50.m_y;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z = local_50.m_z;
  (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w = local_50.m_w;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x = local_60.m_x;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y = local_60.m_y;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z = local_60.m_z;
  (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w = local_60.m_w;
  return __return_storage_ptr__;
}

Assistant:

dgMatrix dgMatrix::operator* (const dgMatrix &B) const
{
	const dgMatrix& A = *this;
	return dgMatrix (dgVector (A[0][0] * B[0][0] + A[0][1] * B[1][0] + A[0][2] * B[2][0] + A[0][3] * B[3][0],
							   A[0][0] * B[0][1] + A[0][1] * B[1][1] + A[0][2] * B[2][1] + A[0][3] * B[3][1],
							   A[0][0] * B[0][2] + A[0][1] * B[1][2] + A[0][2] * B[2][2] + A[0][3] * B[3][2],
							   A[0][0] * B[0][3] + A[0][1] * B[1][3] + A[0][2] * B[2][3] + A[0][3] * B[3][3]),
					 dgVector (A[1][0] * B[0][0] + A[1][1] * B[1][0] + A[1][2] * B[2][0] + A[1][3] * B[3][0],
							   A[1][0] * B[0][1] + A[1][1] * B[1][1] + A[1][2] * B[2][1] + A[1][3] * B[3][1],
							   A[1][0] * B[0][2] + A[1][1] * B[1][2] + A[1][2] * B[2][2] + A[1][3] * B[3][2],
							   A[1][0] * B[0][3] + A[1][1] * B[1][3] + A[1][2] * B[2][3] + A[1][3] * B[3][3]),
					 dgVector (A[2][0] * B[0][0] + A[2][1] * B[1][0] + A[2][2] * B[2][0] + A[2][3] * B[3][0],
							   A[2][0] * B[0][1] + A[2][1] * B[1][1] + A[2][2] * B[2][1] + A[2][3] * B[3][1],
							   A[2][0] * B[0][2] + A[2][1] * B[1][2] + A[2][2] * B[2][2] + A[2][3] * B[3][2],
							   A[2][0] * B[0][3] + A[2][1] * B[1][3] + A[2][2] * B[2][3] + A[2][3] * B[3][3]),
					 dgVector (A[3][0] * B[0][0] + A[3][1] * B[1][0] + A[3][2] * B[2][0] + A[3][3] * B[3][0],
							   A[3][0] * B[0][1] + A[3][1] * B[1][1] + A[3][2] * B[2][1] + A[3][3] * B[3][1],
							   A[3][0] * B[0][2] + A[3][1] * B[1][2] + A[3][2] * B[2][2] + A[3][3] * B[3][2],
							   A[3][0] * B[0][3] + A[3][1] * B[1][3] + A[3][2] * B[2][3] + A[3][3] * B[3][3]));
}